

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

Vec_Wrd_t * Zyx_ManTruthTables(Zyx_Man_t *p,word *pTruth)

{
  int iVar1;
  word wVar2;
  bool bVar3;
  int iVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  Vec_Wrd_t *pVVar10;
  word *__s;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  word *pwVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar27;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  iVar11 = p->nWords;
  lVar17 = (long)iVar11;
  iVar1 = p->nObjs;
  lVar22 = ((long)iVar1 + 1) * lVar17;
  pVVar10 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = (int)lVar22;
  iVar9 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar9 = iVar4;
  }
  pVVar10->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar9 << 3);
  }
  pVVar10->pArray = __s;
  pVVar10->nSize = iVar4;
  memset(__s,0,lVar22 * 8);
  p->vInfo = pVVar10;
  auVar8 = _DAT_0094e250;
  auVar7 = _DAT_0094e240;
  uVar16 = p->pPars->nVars;
  uVar12 = p->pPars->fMajority;
  uVar14 = 1 << ((byte)uVar16 & 0x1f);
  uVar21 = 0x40;
  if (0x40 < (int)uVar14) {
    uVar21 = uVar14;
  }
  if (uVar12 != (pTruth == (word *)0x0)) {
    __assert_fail("p->pPars->fMajority == (pTruth == NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x2f5,"Vec_Wrd_t *Zyx_ManTruthTables(Zyx_Man_t *, word *)");
  }
  if (0 < (int)uVar16) {
    uVar14 = 1 << ((byte)uVar16 - 6 & 0x1f);
    if (uVar16 < 7) {
      uVar14 = 1;
    }
    lVar15 = (ulong)uVar14 - 1;
    auVar23._8_4_ = (int)lVar15;
    auVar23._0_8_ = lVar15;
    auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
    pwVar19 = __s + 1;
    uVar20 = 0;
    auVar23 = auVar23 ^ _DAT_0094e250;
    do {
      if (((long)(uVar20 * lVar17) < 0) || (lVar22 <= (long)(uVar20 * lVar17))) goto LAB_005b4c68;
      iVar9 = auVar23._0_4_;
      iVar25 = auVar23._4_4_;
      if (uVar20 < 6) {
        if (0 < (int)uVar14) {
          wVar2 = s_Truths6[uVar20];
          lVar15 = 0;
          auVar29 = auVar7;
          do {
            auVar28 = auVar29 ^ auVar8;
            bVar3 = iVar9 < auVar28._0_4_;
            iVar30 = auVar28._4_4_;
            if ((bool)(~(iVar25 < iVar30 || iVar30 == iVar25 && bVar3) & 1)) {
              *(word *)((long)pwVar19 + lVar15 + -8) = wVar2;
            }
            if (iVar25 >= iVar30 && (iVar30 != iVar25 || !bVar3)) {
              *(word *)((long)pwVar19 + lVar15) = wVar2;
            }
            lVar27 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar27 + 2;
            lVar15 = lVar15 + 0x10;
          } while ((ulong)(uVar14 + 1 >> 1) << 4 != lVar15);
        }
      }
      else if (0 < (int)uVar14) {
        uVar18 = 1 << ((char)uVar20 - 6U & 0x1f);
        uVar13 = 0;
        auVar28 = auVar7;
        do {
          auVar29 = auVar28 ^ auVar8;
          bVar3 = iVar9 < auVar29._0_4_;
          iVar30 = auVar29._4_4_;
          if ((bool)(~(iVar25 < iVar30 || iVar30 == iVar25 && bVar3) & 1)) {
            pwVar19[uVar13 - 1] = -(ulong)((uVar18 & (uint)uVar13) != 0);
          }
          if (iVar25 >= iVar30 && (iVar30 != iVar25 || !bVar3)) {
            pwVar19[uVar13] = -(ulong)(((uint)uVar13 + 1 & uVar18) != 0);
          }
          uVar13 = uVar13 + 2;
          lVar15 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 2;
          auVar28._8_8_ = lVar15 + 2;
        } while ((uVar14 + 1 & 0xfffffffe) != uVar13);
      }
      uVar20 = uVar20 + 1;
      pwVar19 = pwVar19 + lVar17;
    } while (uVar20 != uVar16);
  }
  auVar8 = _DAT_0095b0f0;
  auVar7 = _DAT_0094e250;
  if (uVar12 != 0) {
    uVar14 = iVar11 * iVar1;
    iVar11 = uVar16 - 1;
    auVar24._4_4_ = iVar11;
    auVar24._0_4_ = iVar11;
    auVar24._8_4_ = iVar11;
    auVar24._12_4_ = iVar11;
    uVar12 = 0;
    auVar24 = auVar24 ^ _DAT_0094e250;
    do {
      iVar11 = 0;
      if (0 < (int)uVar16) {
        auVar31._4_4_ = uVar12;
        auVar31._0_4_ = uVar12;
        auVar31._8_4_ = uVar12;
        auVar31._12_4_ = uVar12;
        auVar34 = (undefined1  [16])0x0;
        auVar33 = auVar8;
        uVar18 = uVar16 + 3 & 0xfffffffc;
        do {
          auVar23 = auVar33;
          auVar28 = auVar34;
          auVar29 = pshuflw(auVar28,auVar23,0xfe);
          auVar33 = pshuflw(in_XMM11,auVar23,0x54);
          auVar32._0_8_ = auVar23._8_8_;
          auVar32._8_4_ = auVar23._8_4_;
          auVar32._12_4_ = auVar23._12_4_;
          auVar34 = pshuflw(auVar33,auVar32,0xfe);
          lVar17 = auVar34._0_8_;
          auVar5._4_8_ = auVar31._8_8_;
          auVar5._0_4_ = uVar12 >> lVar17;
          auVar36._0_8_ = auVar5._0_8_ << 0x20;
          auVar36._8_4_ = uVar12 >> lVar17;
          auVar36._12_4_ = uVar12 >> lVar17;
          auVar34 = pshuflw(auVar32,auVar32,0x54);
          lVar17 = auVar34._0_8_;
          auVar6._4_8_ = auVar31._8_8_;
          auVar6._0_4_ = uVar12 >> lVar17;
          auVar35._0_8_ = auVar6._0_8_ << 0x20;
          auVar35._8_4_ = uVar12 >> lVar17;
          auVar35._12_4_ = uVar12 >> lVar17;
          in_XMM11._8_8_ = auVar36._8_8_;
          in_XMM11._0_8_ = auVar35._8_8_;
          auVar34._0_4_ = (uVar12 >> auVar33._0_8_ & 1) + auVar28._0_4_;
          auVar34._4_4_ = (uVar12 >> auVar29._0_8_ & 1) + auVar28._4_4_;
          auVar34._8_4_ = (auVar35._8_4_ & 1) + auVar28._8_4_;
          auVar34._12_4_ = (auVar36._12_4_ & 1) + auVar28._12_4_;
          auVar33._0_4_ = auVar23._0_4_ + 4;
          auVar33._4_4_ = auVar23._4_4_ + 4;
          auVar33._8_4_ = auVar23._8_4_ + 4;
          auVar33._12_4_ = auVar23._12_4_ + 4;
          uVar18 = uVar18 - 4;
        } while (uVar18 != 0);
        auVar23 = auVar23 ^ auVar7;
        auVar26._0_4_ = -(uint)(auVar24._0_4_ < auVar23._0_4_);
        auVar26._4_4_ = -(uint)(auVar24._4_4_ < auVar23._4_4_);
        auVar26._8_4_ = -(uint)(auVar24._8_4_ < auVar23._8_4_);
        auVar26._12_4_ = -(uint)(auVar24._12_4_ < auVar23._12_4_);
        auVar23 = ~auVar26 & auVar34 | auVar28 & auVar26;
        iVar11 = auVar23._12_4_ + auVar23._4_4_ + auVar23._8_4_ + auVar23._0_4_;
      }
      if ((int)uVar16 / 2 < iVar11) {
        if (iVar4 <= (int)uVar14 || (int)uVar14 < 0) {
LAB_005b4c68:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        __s[(ulong)uVar14 + (ulong)(uVar12 >> 6)] =
             __s[(ulong)uVar14 + (ulong)(uVar12 >> 6)] | 1L << ((byte)uVar12 & 0x3f);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar21);
    uVar20 = 0;
    do {
      iVar11 = p->pPars->nVars / 2;
      if (Abc_TtBitCount8[uVar20 >> 8] + Abc_TtBitCount8[uVar20 & 0xff] == iVar11 + 1 ||
          Abc_TtBitCount8[uVar20 >> 8] + Abc_TtBitCount8[uVar20 & 0xff] == iVar11) {
        Vec_IntPush(p->vMidMints,(int)uVar20);
      }
      uVar16 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar16;
    } while (uVar21 != uVar16);
  }
  return pVVar10;
}

Assistant:

Vec_Wrd_t * Zyx_ManTruthTables( Zyx_Man_t * p, word * pTruth )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->pPars->nVars );
    assert( p->pPars->fMajority == (pTruth == NULL) );
    for ( i = 0; i < p->pPars->nVars; i++ )
        Abc_TtIthVar( Zyx_ManTruth(p, i), i, p->pPars->nVars );
    if ( p->pPars->fMajority )
    {
        for ( i = 0; i < nMints; i++ )
            if ( Zyx_ManValue(i, p->pPars->nVars) )
                Abc_TtSetBit( Zyx_ManTruth(p, p->nObjs), i );
        for ( i = 0; i < nMints; i++ )
            if ( Abc_TtBitCount16(i) == p->pPars->nVars/2 || Abc_TtBitCount16(i) == p->pPars->nVars/2+1 )
                Vec_IntPush( p->vMidMints, i );
    }
    //Dau_DsdPrintFromTruth( Zyx_ManTruth(p, p->nObjs), p->pPars->nVars );
    return vInfo;
}